

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O1

unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
__thiscall sf2cute::SoundFontWriter::MakeSdtaListChunk(SoundFontWriter *this)

{
  long lVar1;
  SoundFont *this_00;
  SFRIFFSmplChunk *this_01;
  long *in_RSI;
  string local_40;
  
  this_00 = (SoundFont *)operator_new(0x40);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"sdta","");
  RIFFListChunk::RIFFListChunk((RIFFListChunk *)this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  lVar1 = *in_RSI;
  this_01 = (SFRIFFSmplChunk *)operator_new(0x18);
  SFRIFFSmplChunk::SFRIFFSmplChunk
            (this_01,(vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                      *)(lVar1 + 0x30));
  local_40._M_dataplus._M_p = (pointer)this_01;
  RIFFListChunk::AddSubchunk
            ((RIFFListChunk *)this_00,
             (unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
              *)&local_40);
  if ((SFRIFFSmplChunk *)local_40._M_dataplus._M_p != (SFRIFFSmplChunk *)0x0) {
    (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
  }
  this->file_ = this_00;
  return (__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
          )(__uniq_ptr_data<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<RIFFChunkInterface> SoundFontWriter::MakeSdtaListChunk() {
  std::unique_ptr<RIFFListChunk> sdta = std::make_unique<RIFFListChunk>("sdta");
  sdta->AddSubchunk(std::make_unique<SFRIFFSmplChunk>(file().samples()));
  return std::move(sdta);
}